

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::IsFileDescriptorProto(FileDescriptor *file,Options *options)

{
  int iVar1;
  int iVar2;
  Descriptor *pDVar3;
  char *in_RCX;
  bool bVar4;
  string_view package;
  string local_c0;
  undefined1 local_a0 [80];
  AlphaNum local_50;
  
  package._M_str = in_RCX;
  package._M_len = **(size_t **)(file + 0x10);
  Namespace_abi_cxx11_(&local_c0,(cpp *)(*(size_t **)(file + 0x10))[1],package);
  local_50.piece_._M_len = 2;
  local_50.piece_._M_str = "::";
  bVar4 = options->opensource_runtime != false;
  local_a0[0x20] = '\x06';
  local_a0[0x21] = '\0';
  local_a0[0x22] = '\0';
  local_a0[0x23] = '\0';
  local_a0[0x24] = '\0';
  local_a0[0x25] = '\0';
  local_a0[0x26] = '\0';
  local_a0[0x27] = '\0';
  if (bVar4) {
    local_a0[0x20] = '\x10';
    local_a0[0x21] = '\0';
    local_a0[0x22] = '\0';
    local_a0[0x23] = '\0';
    local_a0[0x24] = '\0';
    local_a0[0x25] = '\0';
    local_a0[0x26] = '\0';
    local_a0[0x27] = '\0';
  }
  local_a0._40_8_ = "proto2";
  if (bVar4) {
    local_a0._40_8_ = "google::protobuf";
  }
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_a0,&local_50);
  bVar4 = true;
  if (local_c0._M_string_length == local_a0._8_8_) {
    if ((char *)local_c0._M_string_length == (char *)0x0) {
      bVar4 = false;
    }
    else {
      iVar1 = bcmp(local_c0._M_dataplus._M_p,(void *)local_a0._0_8_,local_c0._M_string_length);
      bVar4 = iVar1 != 0;
    }
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    bVar4 = false;
  }
  else {
    bVar4 = 0 < *(int *)(file + 0x3c);
    if (0 < *(int *)(file + 0x3c)) {
      pDVar3 = FileDescriptor::message_type(file,0);
      iVar1 = std::__cxx11::string::compare(*(char **)(pDVar3 + 8));
      if (iVar1 != 0) {
        iVar1 = 1;
        do {
          bVar4 = iVar1 < *(int *)(file + 0x3c);
          if (*(int *)(file + 0x3c) <= iVar1) {
            return bVar4;
          }
          pDVar3 = FileDescriptor::message_type(file,iVar1);
          iVar2 = std::__cxx11::string::compare(*(char **)(pDVar3 + 8));
          iVar1 = iVar1 + 1;
        } while (iVar2 != 0);
      }
    }
  }
  return bVar4;
}

Assistant:

bool IsFileDescriptorProto(const FileDescriptor* file, const Options& options) {
  if (Namespace(file, options) !=
      absl::StrCat("::", ProtobufNamespace(options))) {
    return false;
  }
  for (int i = 0; i < file->message_type_count(); ++i) {
    if (file->message_type(i)->name() == "FileDescriptorProto") return true;
  }
  return false;
}